

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O3

QString * __thiscall
DebugDirCVEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this,size_t fId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(fId) {
  case 0:
    psVar1 = (storage_type *)0x5;
    break;
  case 1:
    psVar1 = (storage_type *)0x9;
    break;
  case 2:
    goto LAB_00132675;
  case 3:
LAB_00132675:
    psVar1 = (storage_type *)0x3;
    break;
  default:
    psVar1 = (storage_type *)0x0;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getFieldName(size_t fId)
{
    switch (fId) {
        case F_CVDBG_SIGN: return "CvSig";
        case F_CVDBG_GUID: return "Signature";
        case F_CVDBG_AGE: return "Age";
        case F_CVDBG_PDB: return "PDB";
    }
    return "";
}